

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O2

void qt_rectfill<unsigned_long_long>
               (unsigned_long_long *dest,unsigned_long_long value,int x,int y,int width,int height,
               qsizetype stride)

{
  int iVar1;
  undefined4 in_register_00000084;
  long lVar2;
  
  lVar2 = (long)x;
  if ((ulong)(uint)width != lVar2 * 8) {
    iVar1 = 0;
    if (0 < y) {
      iVar1 = y;
    }
    while (iVar1 != 0) {
      (*qt_memfill64)(dest,value,lVar2);
      dest = (unsigned_long_long *)((long)dest + CONCAT44(in_register_00000084,width));
      iVar1 = iVar1 + -1;
    }
    return;
  }
  (*qt_memfill64)(dest,value,y * lVar2);
  return;
}

Assistant:

static
inline void qt_rectfill(T *dest, T value,
                        int x, int y, int width, int height, qsizetype stride)
{
    char *d = reinterpret_cast<char*>(dest + x) + y * stride;
    if (uint(stride) == (width * sizeof(T))) {
        qt_memfill(reinterpret_cast<T*>(d), value, qsizetype(width) * height);
    } else {
        for (int j = 0; j < height; ++j) {
            dest = reinterpret_cast<T*>(d);
            qt_memfill(dest, value, width);
            d += stride;
        }
    }
}